

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O0

bool __thiscall Uic::isContainer(Uic *this,QString *className)

{
  initializer_list<QString> args;
  bool bVar1;
  int iVar2;
  Uic *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffff18;
  QStringList *pQVar3;
  QStringList *in_stack_ffffffffffffff20;
  CustomWidgetsInfo *in_stack_ffffffffffffff30;
  QStringList local_b0 [7];
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  if (isContainer(QString_const&)::containers == '\0') {
    iVar2 = __cxa_guard_acquire(&isContainer(QString_const&)::containers);
    if (iVar2 != 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_RDI,(size_t)in_stack_ffffffffffffff20);
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_RDI,(size_t)in_stack_ffffffffffffff20);
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_RDI,(size_t)in_stack_ffffffffffffff20);
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_RDI,(size_t)in_stack_ffffffffffffff20);
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_RDI,(size_t)in_stack_ffffffffffffff20);
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_RDI,(size_t)in_stack_ffffffffffffff20);
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_RDI,(size_t)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff30 = (CustomWidgetsInfo *)local_b0;
      args._M_len = (size_type)in_RDI;
      args._M_array = (iterator)in_stack_ffffffffffffff20;
      QList<QString>::QList(in_stack_ffffffffffffff18,args);
      pQVar3 = local_b0;
      in_stack_ffffffffffffff20 = (QStringList *)&stack0xfffffffffffffff8;
      do {
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + -1;
        QString::~QString((QString *)0x1ecfe8);
      } while (in_stack_ffffffffffffff20 != pQVar3);
      __cxa_atexit(QList<QString>::~QList,&isContainer::containers,&__dso_handle);
      __cxa_guard_release(&isContainer(QString_const&)::containers);
    }
  }
  customWidgetsInfo(in_RDI);
  bVar1 = CustomWidgetsInfo::extendsOneOf
                    (in_stack_ffffffffffffff30,(QString *)in_RDI,in_stack_ffffffffffffff20);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Uic::isContainer(const QString &className) const
{
    static const QStringList containers = {
        u"QStackedWidget"_s, u"QToolBox"_s,
        u"QTabWidget"_s, u"QScrollArea"_s,
        u"QMdiArea"_s, u"QWizard"_s,
        u"QDockWidget"_s
    };

    return customWidgetsInfo()->extendsOneOf(className, containers);
}